

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::preprocessInclude(TraverseSchema *this,DOMElement *elem)

{
  short *psVar1;
  short *psVar2;
  XMLCh *pXVar3;
  NamespaceScope *this_00;
  int iVar4;
  uint uVar5;
  DOMElement *pDVar6;
  XSAnnotation *annotation;
  XMLCh *loc;
  InputSource *source;
  undefined4 extraout_var;
  SchemaInfo *pSVar7;
  XSDDOMParser *this_01;
  DOMDocument *pDVar8;
  undefined4 extraout_var_00;
  XMLCh *text2;
  undefined4 extraout_var_02;
  SchemaInfo *pSVar9;
  long lVar10;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_40;
  XMLCh *schemaURL;
  undefined4 extraout_var_01;
  
  pSVar7 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_40.fScopeAdded = false;
  }
  else {
    local_40.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  local_40.fSchemaInfo = pSVar7;
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,elem,0x19,this,true,this->fNonXSAttList);
  pDVar6 = XUtil::getFirstChildElement(&elem->super_DOMNode);
  pDVar6 = checkContent(this,elem,pDVar6,true,true);
  if (pDVar6 != (DOMElement *)0x0) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x4d);
  }
  if (this->fAnnotation == (XSAnnotation *)0x0) {
    if ((this->fScanner->fGenerateSyntheticAnnotations == true) &&
       (this->fNonXSAttList->fCurCount != 0)) {
      annotation = generateSyntheticAnnotation(this,elem,this->fNonXSAttList);
      this->fAnnotation = annotation;
      SchemaGrammar::addAnnotation(this->fSchemaGrammar,annotation);
    }
  }
  else {
    SchemaGrammar::addAnnotation(this->fSchemaGrammar,this->fAnnotation);
  }
  loc = getElementAttValue(this,elem,(XMLCh *)SchemaSymbols::fgATT_SCHEMALOCATION,AnyURI);
  if ((loc == (XMLCh *)0x0) || (*loc == L'\0')) {
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x4b,L"include",
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    goto LAB_00328230;
  }
  XSDLocator::setValues
            (this->fLocator,this->fSchemaInfo->fCurrentSchemaURL,(XMLCh *)0x0,
             (XMLFileLoc)elem[0x16].super_DOMNode._vptr_DOMNode,
             (XMLFileLoc)elem[0x17].super_DOMNode._vptr_DOMNode);
  source = resolveSchemaLocation(this,loc,SchemaInclude,(XMLCh *)0x0);
  if (source == (InputSource *)0x0) goto LAB_00328230;
  iVar4 = (*source->_vptr_InputSource[5])(source);
  schemaURL = (XMLCh *)CONCAT44(extraout_var,iVar4);
  pSVar7 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                     (this->fCachedSchemaInfoList,schemaURL,this->fTargetNSURI);
  if (pSVar7 == (SchemaInfo *)0x0) {
    if (this->fSchemaInfoList == this->fCachedSchemaInfoList) {
      pSVar7 = (SchemaInfo *)0x0;
    }
    else {
      pSVar7 = RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::get
                         (this->fSchemaInfoList,schemaURL,this->fTargetNSURI);
    }
  }
  if (pSVar7 == (SchemaInfo *)0x0) {
    if (this->fParser == (XSDDOMParser *)0x0) {
      this_01 = (XSDDOMParser *)XMemory::operator_new(0x178,this->fGrammarPoolMemoryManager);
      XSDDOMParser::XSDDOMParser
                (this_01,(XMLValidator *)0x0,this->fGrammarPoolMemoryManager,(XMLGrammarPool *)0x0);
      this->fParser = this_01;
    }
    AbstractDOMParser::setValidationScheme((AbstractDOMParser *)this->fParser,Val_Never);
    AbstractDOMParser::setDoNamespaces((AbstractDOMParser *)this->fParser,true);
    XSDDOMParser::setUserEntityHandler(this->fParser,this->fEntityHandler);
    XSDDOMParser::setUserErrorReporter(this->fParser,this->fErrorReporter);
    uVar5 = (*source->_vptr_InputSource[6])(source);
    (*source->_vptr_InputSource[10])(source,0);
    AbstractDOMParser::parse((AbstractDOMParser *)this->fParser,source);
    (*source->_vptr_InputSource[10])(source,(ulong)(uVar5 & 0xff));
    if ((this->fParser->fSawFatal == true) && (this->fScanner->fExitOnFirstFatal == true)) {
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x105);
    }
    pDVar8 = AbstractDOMParser::getDocument((AbstractDOMParser *)this->fParser);
    if (pDVar8 != (DOMDocument *)0x0) {
      iVar4 = (*(pDVar8->super_DOMDocumentRange)._vptr_DOMDocumentRange[0xd])(pDVar8);
      pDVar6 = (DOMElement *)CONCAT44(extraout_var_00,iVar4);
      if (pDVar6 != (DOMElement *)0x0) {
        iVar4 = (*(pDVar6->super_DOMNode)._vptr_DOMNode[0x29])(pDVar6);
        text2 = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
        if (*text2 == L'\0') {
LAB_003283ce:
          iVar4 = (*(pDVar6->super_DOMNode)._vptr_DOMNode[0x2a])(pDVar6,&XMLUni::fgXMLNSString);
          if ((CONCAT44(extraout_var_02,iVar4) == 0) &&
             (this->fTargetNSURI != this->fEmptyNamespaceURI)) {
            (*(pDVar6->super_DOMNode)._vptr_DOMNode[0x2c])
                      (pDVar6,&XMLUni::fgXMLNSString,this->fTargetNSURIString);
          }
        }
        else {
          pXVar3 = this->fTargetNSURIString;
          if (text2 != pXVar3) {
            if (pXVar3 != (XMLCh *)0x0) {
              lVar10 = 0;
              do {
                psVar1 = (short *)((long)text2 + lVar10);
                if (*psVar1 == 0) {
                  if (*(short *)((long)pXVar3 + lVar10) == 0) goto LAB_003283c9;
                  break;
                }
                psVar2 = (short *)((long)pXVar3 + lVar10);
                lVar10 = lVar10 + 2;
              } while (*psVar1 == *psVar2);
            }
            reportSchemaError(this,pDVar6,L"http://apache.org/xml/messages/XMLErrors",0x4c,loc,text2
                              ,(XMLCh *)0x0,(XMLCh *)0x0);
            goto LAB_00328222;
          }
LAB_003283c9:
          if (*text2 == L'\0') goto LAB_003283ce;
        }
        pSVar7 = this->fSchemaInfo;
        pSVar9 = (SchemaInfo *)XMemory::operator_new(0xe8,this->fMemoryManager);
        SchemaInfo::SchemaInfo
                  (pSVar9,0,0,0,this->fTargetNSURI,(NamespaceScope *)0x0,schemaURL,
                   this->fTargetNSURIString,pDVar6,this->fScanner,this->fGrammarPoolMemoryManager);
        this->fSchemaInfo = pSVar9;
        NamespaceScope::reset(pSVar9->fNamespaceScope,this->fEmptyNamespaceURI);
        this_00 = this->fSchemaInfo->fNamespaceScope;
        uVar5 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                          (this->fURIStringPool,&XMLUni::fgXMLURIName);
        NamespaceScope::addPrefix(this_00,L"xml",uVar5);
        pSVar9 = this->fSchemaInfo;
        RefHash2KeysTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::StringHasher>::put
                  (this->fSchemaInfoList,pSVar9->fCurrentSchemaURL,pSVar9->fTargetNSURI,pSVar9);
        RefHashTableOf<xercesc_4_0::SchemaInfo,_xercesc_4_0::PtrHasher>::put
                  (this->fPreprocessedNodes,elem,this->fSchemaInfo);
        SchemaInfo::addSchemaInfo(pSVar7,this->fSchemaInfo,INCLUDE);
        traverseSchemaHeader(this,pDVar6);
        preprocessChildren(this,pDVar6);
        this->fSchemaInfo = pSVar7;
      }
    }
  }
  else {
    SchemaInfo::addSchemaInfo(this->fSchemaInfo,pSVar7,INCLUDE);
  }
LAB_00328222:
  if (source != (InputSource *)0x0) {
    (*source->_vptr_InputSource[1])(source);
  }
LAB_00328230:
  NamespaceScopeManager::~NamespaceScopeManager(&local_40);
  return;
}

Assistant:

void TraverseSchema::preprocessInclude(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        elem, GeneralAttributeCheck::E_Include, this, true, fNonXSAttList);

    // -----------------------------------------------------------------------
    // First, handle any ANNOTATION declaration
    // -----------------------------------------------------------------------
    if (checkContent(elem, XUtil::getFirstChildElement(elem), true) != 0)
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::OnlyAnnotationExpected);

    if (fAnnotation)
        fSchemaGrammar->addAnnotation(fAnnotation);
    else if (fScanner->getGenerateSyntheticAnnotations() && fNonXSAttList->size())
    {
        fAnnotation = generateSyntheticAnnotation(elem, fNonXSAttList);
        fSchemaGrammar->addAnnotation(fAnnotation);
    }

    // -----------------------------------------------------------------------
    // Get 'schemaLocation' attribute
    // -----------------------------------------------------------------------
    const XMLCh* schemaLocation = getElementAttValue(elem, SchemaSymbols::fgATT_SCHEMALOCATION, DatatypeValidator::AnyURI);

    if (!schemaLocation || !*schemaLocation) {
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DeclarationNoSchemaLocation, SchemaSymbols::fgELT_INCLUDE);
        return;
    }

    // ------------------------------------------------------------------
    // Resolve schema location
    // ------------------------------------------------------------------
    fLocator->setValues(fSchemaInfo->getCurrentSchemaURL(), 0,
                        ((XSDElementNSImpl*) elem)->getLineNo(),
                        ((XSDElementNSImpl*) elem)->getColumnNo());
    InputSource* srcToFill = resolveSchemaLocation(schemaLocation,
            XMLResourceIdentifier::SchemaInclude);
    Janitor<InputSource> janSrc(srcToFill);

    // Nothing to do
    if (!srcToFill) {
        return;
    }

    const XMLCh* includeURL = srcToFill->getSystemId();
    SchemaInfo* includeSchemaInfo = fCachedSchemaInfoList->get(includeURL, fTargetNSURI);

    if (!includeSchemaInfo && fSchemaInfoList != fCachedSchemaInfoList)
      includeSchemaInfo = fSchemaInfoList->get(includeURL, fTargetNSURI);

    if (includeSchemaInfo) {

        fSchemaInfo->addSchemaInfo(includeSchemaInfo, SchemaInfo::INCLUDE);
        return;
    }

    // ------------------------------------------------------------------
    // Parse input source
    // ------------------------------------------------------------------
    if (!fParser)
        fParser = new (fGrammarPoolMemoryManager) XSDDOMParser(0, fGrammarPoolMemoryManager, 0);

    fParser->setValidationScheme(XercesDOMParser::Val_Never);
    fParser->setDoNamespaces(true);
    fParser->setUserEntityHandler(fEntityHandler);
    fParser->setUserErrorReporter(fErrorReporter);

    // Should just issue warning if the schema is not found
    bool flag = srcToFill->getIssueFatalErrorIfNotFound();
    srcToFill->setIssueFatalErrorIfNotFound(false);

    fParser->parse(*srcToFill);

    // Reset the InputSource
    srcToFill->setIssueFatalErrorIfNotFound(flag);

    if (fParser->getSawFatal() && fScanner->getExitOnFirstFatal())
        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::SchemaScanFatalError);

    // ------------------------------------------------------------------
    // Get root element
    // ------------------------------------------------------------------
    DOMDocument* document = fParser->getDocument();

    if (document) {

        DOMElement* root = document->getDocumentElement();

        if (root) {

            const XMLCh* targetNSURIString = root->getAttribute(SchemaSymbols::fgATT_TARGETNAMESPACE);

            // check to see if targetNameSpace is right
            if (*targetNSURIString
                && !XMLString::equals(targetNSURIString,fTargetNSURIString)){
                reportSchemaError(root, XMLUni::fgXMLErrDomain, XMLErrs::IncludeNamespaceDifference,
                                  schemaLocation, targetNSURIString);
                return;
            }

            // if targetNamespace is empty, change it to includ'g schema
            // targetNamespace
            if (!*targetNSURIString && root->getAttributeNode(XMLUni::fgXMLNSString) == 0
                && fTargetNSURI != fEmptyNamespaceURI) {
                root->setAttribute(XMLUni::fgXMLNSString, fTargetNSURIString);
            }

            // --------------------------------------------------------
            // Update schema information with included schema
            // --------------------------------------------------------
            SchemaInfo* saveInfo = fSchemaInfo;

            fSchemaInfo = new (fMemoryManager) SchemaInfo(0, 0, 0, fTargetNSURI,
                                         0,
                                         includeURL,
                                         fTargetNSURIString, root,
                                         fScanner,
                                         fGrammarPoolMemoryManager);

            fSchemaInfo->getNamespaceScope()->reset(fEmptyNamespaceURI);
            // Add mapping for the xml prefix
            fSchemaInfo->getNamespaceScope()->addPrefix(XMLUni::fgXMLString, fURIStringPool->addOrFind(XMLUni::fgXMLURIName));

            fSchemaInfoList->put((void*) fSchemaInfo->getCurrentSchemaURL(),
                                 fSchemaInfo->getTargetNSURI(), fSchemaInfo);
            fPreprocessedNodes->put((void*) elem, fSchemaInfo);
            saveInfo->addSchemaInfo(fSchemaInfo, SchemaInfo::INCLUDE);
            traverseSchemaHeader(root);
            preprocessChildren(root);
            fSchemaInfo = saveInfo;
        }
    }
}